

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_perftest.cc
# Opt level: O1

int LoadManifests(bool measure_command_evaluation)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  undefined8 extraout_RAX;
  int iVar4;
  ulong uVar5;
  RealDiskInterface disk_interface;
  string err;
  State state;
  ManifestParser parser;
  string local_1e0;
  FileReader local_1c0;
  string local_1b8;
  State local_198;
  ManifestParser local_90;
  
  paVar1 = &local_1b8.field_2;
  local_1b8._M_string_length = 0;
  local_1b8.field_2._M_local_buf[0] = '\0';
  local_1c0._vptr_FileReader = (_func_int **)&PTR__FileReader_001369d8;
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  State::State(&local_198);
  ManifestParser::ManifestParser(&local_90,&local_198,&local_1c0,(ManifestParserOptions)0x0);
  paVar2 = &local_1e0.field_2;
  local_1e0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"build.ninja","");
  bVar3 = Parser::Load(&local_90.super_Parser,&local_1e0,&local_1b8,(Lexer *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    iVar4 = 0;
    if ((measure_command_evaluation) &&
       (iVar4 = 0,
       local_198.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
       super__Vector_impl_data._M_finish !=
       local_198.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
       super__Vector_impl_data._M_start)) {
      uVar5 = 0;
      iVar4 = 0;
      do {
        Edge::EvaluateCommand_abi_cxx11_
                  (&local_1e0,
                   local_198.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar5],false);
        iVar4 = iVar4 + (int)local_1e0._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != paVar2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)((long)local_198.edges_.
                                     super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)local_198.edges_.
                                     super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                                     super__Vector_impl_data._M_start >> 3));
    }
    if (local_198.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_198.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_198.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_198.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    local_198.bindings_.super_Env._vptr_Env = (_func_int **)&PTR__BindingEnv_00136a60;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
    ::~_Rb_tree(&local_198.bindings_.rules_._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_198.bindings_.bindings_._M_t);
    if (local_198.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_198.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_198.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_198.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
    ::~_Rb_tree(&local_198.pools_._M_t);
    std::
    _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_dataplus._M_p,
                      CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                               local_1b8.field_2._M_local_buf[0]) + 1);
    }
    return iVar4;
  }
  LoadManifests();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  State::~State(&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,
                    CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                             local_1b8.field_2._M_local_buf[0]) + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int LoadManifests(bool measure_command_evaluation) {
  string err;
  RealDiskInterface disk_interface;
  State state;
  ManifestParser parser(&state, &disk_interface);
  if (!parser.Load("build.ninja", &err)) {
    fprintf(stderr, "Failed to read test data: %s\n", err.c_str());
    exit(1);
  }
  // Doing an empty build involves reading the manifest and evaluating all
  // commands required for the requested targets. So include command
  // evaluation in the perftest by default.
  int optimization_guard = 0;
  if (measure_command_evaluation)
    for (size_t i = 0; i < state.edges_.size(); ++i)
      optimization_guard += state.edges_[i]->EvaluateCommand().size();
  return optimization_guard;
}